

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::pushConditionalResult(Parser *this,ConditionalResult cond)

{
  value_type local_2;
  
  std::vector<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>::push_back
            (&this->conditionStack,&local_2);
  return;
}

Assistant:

void Parser::pushConditionalResult(ConditionalResult cond)
{
	ConditionInfo info = conditionStack.back();
	info.inTrueBlock = info.inTrueBlock && cond != ConditionalResult::False;
	info.inUnknownBlock = info.inUnknownBlock || cond == ConditionalResult::Unknown;
	conditionStack.push_back(info);
}